

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void par_shapes_merge_and_free(par_shapes_mesh *dst,par_shapes_mesh *src)

{
  uint uVar1;
  uint16_t *puVar2;
  float *pfVar3;
  uint16_t *puVar4;
  int iVar5;
  int iVar7;
  int iVar8;
  ulong uVar9;
  short sVar10;
  long in_FS_OFFSET;
  ulong uVar6;
  
  uVar1 = dst->npoints;
  iVar7 = src->npoints + uVar1;
  pfVar3 = (float *)rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x430),dst->points,
                                       iVar7 * 0xc,uVar1 * 3);
  dst->points = pfVar3;
  memcpy(pfVar3 + (long)dst->npoints * 3,src->points,(long)src->npoints * 0xc);
  dst->npoints = iVar7;
  if (src->normals != (float *)0x0 || dst->normals != (float *)0x0) {
    pfVar3 = (float *)rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x430),dst->normals,
                                         iVar7 * 0xc,uVar1 * 3);
    dst->normals = pfVar3;
    if (src->normals != (float *)0x0) {
      memcpy((void *)((long)pfVar3 + (ulong)((uVar1 & 0xffff) * 0xc)),src->normals,
             (long)src->npoints * 0xc);
    }
  }
  if (src->tcoords != (float *)0x0 || dst->tcoords != (float *)0x0) {
    pfVar3 = (float *)rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x430),dst->tcoords,
                                         iVar7 * 8,uVar1 * 2);
    dst->tcoords = pfVar3;
    if (src->tcoords != (float *)0x0) {
      memcpy(pfVar3 + (uVar1 * 2 & 0x1fffe),src->tcoords,(long)src->npoints << 3);
    }
  }
  iVar8 = src->ntriangles + dst->ntriangles;
  puVar4 = (uint16_t *)
           rf_realloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x430),dst->triangles,iVar8 * 6,
                              dst->ntriangles * 3);
  dst->triangles = puVar4;
  iVar7 = dst->ntriangles;
  puVar2 = src->triangles;
  uVar9 = 0;
  uVar6 = (ulong)(uint)src->ntriangles;
  if (src->ntriangles < 1) {
    uVar6 = uVar9;
  }
  while (iVar5 = (int)uVar6, uVar6 = (ulong)(iVar5 - 1), iVar5 != 0) {
    sVar10 = (short)uVar1;
    *(short *)((long)puVar4 + uVar9 + (long)(iVar7 * 3) * 2) =
         *(short *)((long)puVar2 + uVar9) + sVar10;
    *(short *)((long)puVar4 + uVar9 + (long)(iVar7 * 3) * 2 + 2) =
         *(short *)((long)puVar2 + uVar9 + 2) + sVar10;
    *(short *)((long)puVar4 + uVar9 + (long)(iVar7 * 3) * 2 + 4) =
         *(short *)((long)puVar2 + uVar9 + 4) + sVar10;
    uVar9 = uVar9 + 6;
  }
  dst->ntriangles = iVar8;
  par_shapes_free_mesh(src);
  return;
}

Assistant:

PARDEF void par_shapes_merge_and_free(par_shapes_mesh* dst, par_shapes_mesh* src)
{
    par_shapes_merge(dst, src);
    par_shapes_free_mesh(src);
}